

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnTryTableExpr
          (BinaryReaderInterp *this,Type sig_type,CatchClauseVector *catches)

{
  Offset OVar1;
  pointer pTVar2;
  pointer pTVar3;
  size_t sVar4;
  char *pcVar5;
  string_view *psVar6;
  Result RVar7;
  Offset fixup_offset;
  Offset OVar8;
  undefined4 extraout_var;
  TypeVector *pTVar9;
  Enum EVar10;
  CatchClause *raw_catch;
  pointer pCVar11;
  Index catch_drop_count_00;
  int iVar12;
  u32 exn_stack_height;
  Index catch_drop_count;
  Label *vlabel;
  Location loc;
  Index local_1dc;
  TypeChecker *local_1d8;
  ulong local_1d0;
  string_view *local_1c8;
  SharedValidator *local_1c0;
  Location local_1b8;
  HandlerDesc local_190;
  Type local_158;
  pointer local_150;
  pointer local_148;
  pointer local_140;
  undefined1 local_138 [8];
  char *pcStack_130;
  anon_union_16_2_ecfd7102_for_Location_1 local_128 [4];
  TableCatch local_e8;
  
  local_1c0 = &this->validator_;
  local_e8.loc.field_1.field_0.last_column = 0;
  local_e8.loc.filename._M_len = (this->filename_)._M_len;
  pcVar5 = (this->filename_)._M_str;
  local_e8.loc.filename._M_str._0_4_ = SUB84(pcVar5,0);
  local_e8.loc.filename._M_str._4_4_ = (undefined4)((ulong)pcVar5 >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_e8.loc.field_1.field_0.line = (int)OVar1;
  local_e8.loc.field_1.field_0.first_column = (int)(OVar1 >> 0x20);
  RVar7 = SharedValidator::BeginTryTable(local_1c0,&local_e8.loc,sig_type);
  EVar10 = Error;
  if (RVar7.enum_ != Error) {
    local_1d8 = &(this->validator_).typechecker_;
    RVar7 = TypeChecker::GetCatchCount
                      (local_1d8,
                       (int)((ulong)((long)(this->label_stack_).
                                           super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->label_stack_).
                                          super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1,
                       &local_1dc);
    EVar10 = Error;
    if (RVar7.enum_ != Error) {
      local_1c8 = &this->filename_;
      local_190.values =
           (int)((ulong)((long)(this->validator_).typechecker_.type_stack_.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->validator_).typechecker_.type_stack_.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) + this->local_count_;
      local_190.kind = Catch;
      local_190.try_start_offset = 0xffffffff;
      local_190.try_end_offset = 0xffffffff;
      local_190.catches.
      super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_190.catches.
      super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>._M_impl.
      super__Vector_impl_data._M_finish = (CatchDesc *)0x0;
      local_190.catches.
      super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (CatchDesc *)0x0;
      local_190.field_4.catch_all_offset = 0xffffffff;
      local_190.exceptions = local_1dc;
      local_190.catch_all_ref = false;
      local_158 = sig_type;
      Istream::Emit(this->istream_,Br);
      fixup_offset = Istream::EmitFixupU32(this->istream_);
      pCVar11 = (catches->super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      local_140 = (catches->
                  super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>)._M_impl
                  .super__Vector_impl_data._M_finish;
      if (pCVar11 != local_140) {
        local_1d0 = 0;
        do {
          local_e8.loc.field_1.field_0.line = 0;
          local_e8.loc.field_1.field_0.first_column = 0;
          local_e8.loc.field_1.field_0.last_column = 0;
          local_e8.loc.filename._M_len = 0;
          local_e8.loc.filename._M_str._0_4_ = 0;
          local_e8.loc.filename._M_str._4_4_ = 0;
          Var::Var(&local_e8.tag);
          Var::Var(&local_e8.target);
          psVar6 = local_1c8;
          local_e8.kind = pCVar11->kind;
          local_1b8.field_1.field_0.last_column = 0;
          local_1b8.filename._M_len = local_1c8->_M_len;
          local_1b8.filename._M_str = local_1c8->_M_str;
          local_1b8.field_1.field_1.offset =
               (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
               ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
          Var::Var((Var *)local_138,pCVar11->tag,&local_1b8);
          Var::operator=(&local_e8.tag,(Var *)local_138);
          Var::~Var((Var *)local_138);
          local_1b8.field_1.field_0.last_column = 0;
          local_1b8.filename._M_len = psVar6->_M_len;
          local_1b8.filename._M_str = psVar6->_M_str;
          local_1b8.field_1.field_1.offset =
               (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
               ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
          Var::Var((Var *)local_138,pCVar11->depth,&local_1b8);
          Var::operator=(&local_e8.target,(Var *)local_138);
          Var::~Var((Var *)local_138);
          local_128[0].field_0.last_column = 0;
          local_138 = (undefined1  [8])psVar6->_M_len;
          pcStack_130 = psVar6->_M_str;
          local_128[0]._0_8_ =
               ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
          RVar7 = SharedValidator::OnTryTableCatch(local_1c0,(Location *)local_138,&local_e8);
          iVar12 = 1;
          if ((RVar7.enum_ != Error) && (iVar12 = 7, (local_1d0 & 1) == 0)) {
            if ((local_e8.kind & ~CatchRef) == CatchAll) {
              local_190.catch_all_ref = (bool)((byte)local_e8.kind & 1);
              local_190.field_4.catch_all_offset = Istream::end(this->istream_);
              local_1d0 = CONCAT71((int7)(CONCAT44(extraout_var,local_190.field_4.catch_all_offset)
                                         >> 8),1);
            }
            else {
              local_138._0_4_ = pCVar11->tag;
              OVar8 = Istream::end(this->istream_);
              local_138._4_4_ = OVar8;
              pcStack_130 = (char *)CONCAT71(pcStack_130._1_7_,
                                             (local_e8.kind & ~CatchAll) == CatchRef);
              pcVar5 = pcStack_130;
              if (local_190.catches.
                  super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_190.catches.
                  super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::
                _M_realloc_insert<wabt::interp::CatchDesc>
                          (&local_190.catches,
                           (iterator)
                           local_190.catches.
                           super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(CatchDesc *)local_138);
              }
              else {
                (local_190.catches.
                 super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->ref = pcStack_130._0_1_;
                *(undefined3 *)
                 &(local_190.catches.
                   super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->field_0x9 = pcStack_130._1_3_;
                (local_190.catches.
                 super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->tag_index = local_138._0_4_;
                (local_190.catches.
                 super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->offset = OVar8;
                local_190.catches.
                super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_190.catches.
                     super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
                pcStack_130 = pcVar5;
              }
            }
            RVar7 = TypeChecker::GetLabel(local_1d8,pCVar11->depth,(Label **)local_138);
            iVar12 = 1;
            if (RVar7.enum_ != Error) {
              pTVar9 = (TypeVector *)((long)local_138 + 0x20);
              if (*(LabelType *)local_138 == Loop) {
                pTVar9 = (TypeVector *)((long)local_138 + 8);
              }
              local_148 = (pTVar9->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                          _M_impl.super__Vector_impl_data._M_start;
              pTVar2 = (pTVar9->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl
                       .super__Vector_impl_data._M_finish;
              local_150 = (this->validator_).typechecker_.type_stack_.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start;
              pTVar3 = (this->validator_).typechecker_.type_stack_.
                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              sVar4 = *(size_t *)((long)local_138 + 0x38);
              RVar7 = TypeChecker::GetCatchCount(local_1d8,pCVar11->depth,(Index *)&local_1b8);
              iVar12 = 1;
              if (RVar7.enum_ != Error) {
                catch_drop_count_00 = (int)local_1b8.filename._M_len + 1;
                local_1b8.filename._M_len =
                     CONCAT44(local_1b8.filename._M_len._4_4_,catch_drop_count_00);
                EmitBr(this,pCVar11->depth,
                       (int)((ulong)((long)pTVar3 - (long)local_150) >> 3) - (int)sVar4,
                       (Index)((ulong)((long)pTVar2 - (long)local_148) >> 3),catch_drop_count_00);
                iVar12 = 0;
              }
            }
          }
          Var::~Var(&local_e8.target);
          Var::~Var(&local_e8.tag);
          if ((iVar12 != 7) && (iVar12 != 0)) {
            EVar10 = Error;
            goto LAB_001ae06d;
          }
          pCVar11 = pCVar11 + 1;
        } while (pCVar11 != local_140);
      }
      local_e8.loc.field_1.field_0.last_column = 0;
      local_e8.loc.filename._M_len = local_1c8->_M_len;
      local_e8.loc.filename._M_str._0_4_ = SUB84(local_1c8->_M_str,0);
      local_e8.loc.filename._M_str._4_4_ = (undefined4)((ulong)local_1c8->_M_str >> 0x20);
      OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      local_e8.loc.field_1.field_0.line = (int)OVar1;
      local_e8.loc.field_1.field_0.first_column = (int)(OVar1 >> 0x20);
      RVar7 = SharedValidator::EndTryTable(local_1c0,&local_e8.loc,local_158);
      EVar10 = Error;
      if (RVar7.enum_ != Error) {
        OVar8 = Istream::end(this->istream_);
        local_190.try_start_offset = OVar8;
        PushLabel(this,Try,0xffffffff,0xffffffff,
                  (int)((ulong)((long)(this->func_->handlers).
                                      super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->func_->handlers).
                                     super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249)
        ;
        std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
        emplace_back<wabt::interp::HandlerDesc>(&this->func_->handlers,&local_190);
        Istream::ResolveFixupU32(this->istream_,fixup_offset);
        EVar10 = Ok;
      }
LAB_001ae06d:
      if (local_190.catches.
          super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_190.catches.
                        super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_190.catches.
                              super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_190.catches.
                              super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return (Result)EVar10;
}

Assistant:

Result BinaryReaderInterp::OnTryTableExpr(Type sig_type,
                                          const CatchClauseVector& catches) {
  // we can just emit the catch handlers beforehand, so long as we skip over
  // them when entering the try.
  CHECK_RESULT(validator_.BeginTryTable(GetLocation(), sig_type));

  u32 exn_stack_height;
  CHECK_RESULT(
      validator_.GetCatchCount(label_stack_.size() - 1, &exn_stack_height));
  // NOTE: *NOT* GetLocalCount. we don't count the parameters, as they're not
  // part of the frame.
  u32 value_stack_height = validator_.type_stack_size() + local_count_;

  HandlerDesc desc =
      HandlerDesc{HandlerKind::Catch,        Istream::kInvalidOffset,
                  Istream::kInvalidOffset,   {},
                  {Istream::kInvalidOffset}, value_stack_height,
                  exn_stack_height};

  istream_.Emit(Opcode::Br);
  auto offset = istream_.EmitFixupU32();

  bool has_catch_all = false;
  for (const auto& raw_catch : catches) {
    TableCatch catch_;
    catch_.kind = raw_catch.kind;
    catch_.tag = Var(raw_catch.tag, GetLocation());
    catch_.target = Var(raw_catch.depth, GetLocation());
    CHECK_RESULT(validator_.OnTryTableCatch(GetLocation(), catch_));
    // stop emitting handlers after catch_all - but we must still validate the
    // handlers we don't emit
    if (has_catch_all) {
      continue;
    }
    if (catch_.IsCatchAll()) {
      has_catch_all = true;
      desc.catch_all_ref = catch_.IsRef();
      desc.catch_all_offset = istream_.end();
    } else {
      desc.catches.push_back(
          CatchDesc{raw_catch.tag, istream_.end(), catch_.IsRef()});
    }
    // we can't use GetBrDropKeepCount because we're not in a real block.
    SharedValidator::Label* vlabel;
    CHECK_RESULT(validator_.GetLabel(raw_catch.depth, &vlabel));
    // we keep the exception's results.
    // (this has already been validated, above)
    Index keep_count = vlabel->br_types().size();
    // we drop everything between the current block and the br target.
    // (we have already taken the TryTable block parameters into account, in
    // BeginTryTable)
    Index drop_count = validator_.type_stack_size() - vlabel->type_stack_limit;
    Index catch_drop_count;
    // we use the regular catch count
    CHECK_RESULT(validator_.GetCatchCount(raw_catch.depth, &catch_drop_count));
    // but increment, as we are semantically in a catch
    catch_drop_count++;
    EmitBr(raw_catch.depth, drop_count, keep_count, catch_drop_count);
  }

  CHECK_RESULT(validator_.EndTryTable(GetLocation(), sig_type));

  desc.try_start_offset = istream_.end();

  // as usual, the label is pushed after the catch handlers
  PushLabel(LabelKind::Try, Istream::kInvalidOffset, Istream::kInvalidOffset,
            func_->handlers.size());
  func_->handlers.push_back(std::move(desc));

  istream_.ResolveFixupU32(offset);

  return Result::Ok;
}